

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O2

void plutovg_path_add_arc
               (plutovg_path_t *path,float cx,float cy,float r,float a0,float a1,_Bool ccw)

{
  int iVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float x1;
  float fVar6;
  float y1;
  float local_b0;
  float local_a8;
  float fStack_a4;
  
  fVar6 = a1 - a0;
  fVar4 = 6.2831855;
  if (ABS(fVar6) <= 6.2831855) {
    fVar4 = fVar6;
    if (((fVar6 != 0.0) || (NAN(fVar6))) && (0.0 <= fVar6 == ccw)) {
      if (ccw) {
        fVar4 = -6.2831855;
      }
      else {
        fVar4 = 6.2831855;
      }
      fVar4 = fVar4 + fVar6;
    }
  }
  fVar6 = ceilf(ABS(fVar4) / 1.5707964);
  iVar2 = (int)fVar6;
  if (iVar2 != 0) {
    fVar6 = cosf(a0);
    fVar3 = sinf(a0);
    local_a8 = fVar3 * r + cy;
    fStack_a4 = fVar6 * r + cx;
    fVar5 = ((fVar4 / (float)iVar2) / 1.5707964) * 0.5522848 * r;
    fVar6 = sinf(a0);
    fVar3 = cosf(a0);
    plutovg_path_reserve(path,iVar2 * 4 + 2);
    if ((path->elements).size == 0) {
      plutovg_path_move_to(path,fStack_a4,local_a8);
    }
    else {
      plutovg_path_line_to(path,fStack_a4,local_a8);
    }
    fVar6 = -fVar6 * fVar5;
    fVar3 = fVar3 * fVar5;
    iVar1 = 0;
    local_b0 = a0;
    if (0 < iVar2) {
      iVar1 = iVar2;
    }
    while (iVar1 != 0) {
      x1 = fVar6 + fStack_a4;
      y1 = fVar3 + local_a8;
      local_b0 = local_b0 + fVar4 / (float)iVar2;
      fVar6 = cosf(local_b0);
      fVar3 = sinf(local_b0);
      local_a8 = fVar3 * r + cy;
      fStack_a4 = fVar6 * r + cx;
      fVar6 = sinf(local_b0);
      fVar6 = -fVar6 * fVar5;
      fVar3 = cosf(local_b0);
      fVar3 = fVar3 * fVar5;
      plutovg_path_cubic_to(path,x1,y1,fStack_a4 - fVar6,local_a8 - fVar3,fStack_a4,local_a8);
      iVar1 = iVar1 + -1;
    }
  }
  return;
}

Assistant:

void plutovg_path_add_arc(plutovg_path_t* path, float cx, float cy, float r, float a0, float a1, bool ccw)
{
    float da = a1 - a0;
    if(fabsf(da) > PLUTOVG_TWO_PI) {
        da = PLUTOVG_TWO_PI;
    } else if(da != 0.f && ccw != (da < 0.f)) {
        da += PLUTOVG_TWO_PI * (ccw ? -1 : 1);
    }

    int seg_n = (int)(ceilf(fabsf(da) / PLUTOVG_HALF_PI));
    if(seg_n == 0)
        return;
    float a = a0;
    float ax = cx + cosf(a) * r;
    float ay = cy + sinf(a) * r;

    float seg_a = da / seg_n;
    float d = (seg_a / PLUTOVG_HALF_PI) * PLUTOVG_KAPPA * r;
    float dx = -sinf(a) * d;
    float dy = cosf(a) * d;

    plutovg_path_reserve(path, 2 + 4 * seg_n);
    if(path->elements.size == 0) {
        plutovg_path_move_to(path, ax, ay);
    } else {
        plutovg_path_line_to(path, ax, ay);
    }

    for(int i = 0; i < seg_n; i++) {
        float cp1x = ax + dx;
        float cp1y = ay + dy;

        a += seg_a;
        ax = cx + cosf(a) * r;
        ay = cy + sinf(a) * r;

        dx = -sinf(a) * d;
        dy = cosf(a) * d;

        float cp2x = ax - dx;
        float cp2y = ay - dy;

        plutovg_path_cubic_to(path, cp1x, cp1y, cp2x, cp2y, ax, ay);
    }
}